

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O2

void __thiscall
compiler::CompilerAstWalker::onExitAssignStatementAstNode
          (CompilerAstWalker *this,AssignStatementAstNode *node)

{
  bool mustBeTrue;
  string local_48;
  size_t local_28;
  size_t index;
  
  local_28 = 0;
  mustBeTrue = EmissionContext::GetDeclarationIndex
                         ((this->ec).
                          super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,&((node->identifier).
                                   super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                                  value,&local_28,false);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Could not find local declaration for assign statement",
             (allocator<char> *)((long)&index + 7));
  Error::assertWithPanic(mustBeTrue,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  emit(this,SetLocal,local_28);
  return;
}

Assistant:

void onExitAssignStatementAstNode(AssignStatementAstNode* node) noexcept override {
    std::size_t index = 0;
    bool find = this->ec->GetDeclarationIndex(node->identifier->value, index, false);
    Error::assertWithPanic(find, "Could not find local declaration for assign statement");
    this->emit(bytecode::ByteCodeInstruction::SetLocal, index);
  }